

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O3

int MuxImageParse(WebPChunk *chunk,int copy_data,WebPMuxImage *wpi)

{
  WebPMuxError WVar1;
  WebPChunkId WVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  size_t data_size;
  WebPChunk **unknown_chunk_list;
  WebPData temp;
  WebPChunk subchunk;
  WebPChunk **local_68;
  WebPData local_60;
  WebPChunk local_50;
  
  puVar8 = (chunk->data_).bytes;
  uVar5 = (chunk->data_).size;
  puVar7 = puVar8 + uVar5;
  if (puVar8 == (uint8_t *)0x0) {
    puVar7 = (uint8_t *)0x0;
  }
  local_68 = &wpi->unknown_;
  ChunkInit(&local_50);
  local_60.size = 0x10;
  local_60.bytes = puVar8;
  if (0xf < uVar5) {
    ChunkAssignData(&local_50,&local_60,copy_data,chunk->tag_);
    ChunkSetHead(&local_50,&wpi->header_);
    wpi->is_partial_ = 1;
    uVar4 = (ulong)((int)local_50.data_.size + 1U & 0xfffffffe);
    puVar8 = puVar8 + uVar4;
    if (puVar8 != puVar7) {
      data_size = uVar5 - uVar4;
      do {
        ChunkInit(&local_50);
        WVar1 = ChunkVerifyAndAssign(&local_50,puVar8,data_size,data_size,copy_data);
        if (WVar1 != WEBP_MUX_OK) goto LAB_00106f1d;
        WVar2 = ChunkGetIdFromTag(local_50.tag_);
        if (WVar2 == WEBP_CHUNK_UNKNOWN) {
          if ((wpi->is_partial_ != 0) ||
             (WVar1 = ChunkAppend(&local_50,&local_68), WVar1 != WEBP_MUX_OK)) goto LAB_00106f1d;
        }
        else {
          if (WVar2 == WEBP_CHUNK_IMAGE) {
            if ((wpi->img_ != (WebPChunk *)0x0) ||
               (WVar1 = ChunkSetHead(&local_50,&wpi->img_), WVar1 != WEBP_MUX_OK))
            goto LAB_00106f1d;
            iVar3 = MuxImageFinalize(wpi);
            iVar6 = 0;
            if (iVar3 == 0) goto LAB_00106f1d;
          }
          else {
            if ((WVar2 != WEBP_CHUNK_ALPHA) || (wpi->alpha_ != (WebPChunk *)0x0)) goto LAB_00106f1d;
            WVar1 = ChunkSetHead(&local_50,&wpi->alpha_);
            iVar6 = 1;
            if (WVar1 != WEBP_MUX_OK) goto LAB_00106f1d;
          }
          wpi->is_partial_ = iVar6;
        }
        uVar5 = (ulong)((int)local_50.data_.size + 1U & 0xfffffffe);
        puVar8 = puVar8 + uVar5 + 8;
        data_size = data_size - (uVar5 + 8);
      } while (puVar8 != puVar7);
      if (wpi->is_partial_ == 0) {
        return 1;
      }
    }
  }
LAB_00106f1d:
  ChunkRelease(&local_50);
  return 0;
}

Assistant:

static int MuxImageParse(const WebPChunk* const chunk, int copy_data,
                         WebPMuxImage* const wpi) {
  const uint8_t* bytes = chunk->data_.bytes;
  size_t size = chunk->data_.size;
  const uint8_t* const last = (bytes == NULL) ? NULL : bytes + size;
  WebPChunk subchunk;
  size_t subchunk_size;
  WebPChunk** unknown_chunk_list = &wpi->unknown_;
  ChunkInit(&subchunk);

  assert(chunk->tag_ == kChunks[IDX_ANMF].tag);
  assert(!wpi->is_partial_);

  // ANMF.
  {
    const size_t hdr_size = ANMF_CHUNK_SIZE;
    const WebPData temp = { bytes, hdr_size };
    // Each of ANMF chunk contain a header at the beginning. So, its size should
    // be at least 'hdr_size'.
    if (size < hdr_size) goto Fail;
    ChunkAssignData(&subchunk, &temp, copy_data, chunk->tag_);
  }
  ChunkSetHead(&subchunk, &wpi->header_);
  wpi->is_partial_ = 1;  // Waiting for ALPH and/or VP8/VP8L chunks.

  // Rest of the chunks.
  subchunk_size = ChunkDiskSize(&subchunk) - CHUNK_HEADER_SIZE;
  bytes += subchunk_size;
  size -= subchunk_size;

  while (bytes != last) {
    ChunkInit(&subchunk);
    if (ChunkVerifyAndAssign(&subchunk, bytes, size, size,
                             copy_data) != WEBP_MUX_OK) {
      goto Fail;
    }
    switch (ChunkGetIdFromTag(subchunk.tag_)) {
      case WEBP_CHUNK_ALPHA:
        if (wpi->alpha_ != NULL) goto Fail;  // Consecutive ALPH chunks.
        if (ChunkSetHead(&subchunk, &wpi->alpha_) != WEBP_MUX_OK) goto Fail;
        wpi->is_partial_ = 1;  // Waiting for a VP8 chunk.
        break;
      case WEBP_CHUNK_IMAGE:
        if (wpi->img_ != NULL) goto Fail;  // Only 1 image chunk allowed.
        if (ChunkSetHead(&subchunk, &wpi->img_) != WEBP_MUX_OK) goto Fail;
        if (!MuxImageFinalize(wpi)) goto Fail;
        wpi->is_partial_ = 0;  // wpi is completely filled.
        break;
      case WEBP_CHUNK_UNKNOWN:
        if (wpi->is_partial_) {
          goto Fail;  // Encountered an unknown chunk
                      // before some image chunks.
        }
        if (ChunkAppend(&subchunk, &unknown_chunk_list) != WEBP_MUX_OK) {
          goto Fail;
        }
        break;
      default:
        goto Fail;
    }
    subchunk_size = ChunkDiskSize(&subchunk);
    bytes += subchunk_size;
    size -= subchunk_size;
  }
  if (wpi->is_partial_) goto Fail;
  return 1;

 Fail:
  ChunkRelease(&subchunk);
  return 0;
}